

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)23>_> *
vkt::tessellation::makeFramebuffer
          (Move<vk::Handle<(vk::HandleType)23>_> *__return_storage_ptr__,DeviceInterface *vk,
          VkDevice device,VkRenderPass renderPass,VkImageView colorAttachment,deUint32 width,
          deUint32 height,deUint32 layers)

{
  undefined1 local_78 [8];
  VkFramebufferCreateInfo framebufferInfo;
  deUint32 width_local;
  VkDevice device_local;
  DeviceInterface *vk_local;
  VkImageView colorAttachment_local;
  VkRenderPass renderPass_local;
  
  local_78._0_4_ = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
  framebufferInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  framebufferInfo._4_4_ = 0;
  framebufferInfo.pNext._0_4_ = 0;
  framebufferInfo.renderPass.m_internal._0_4_ = 1;
  framebufferInfo._32_8_ = &vk_local;
  framebufferInfo.pAttachments._4_4_ = height;
  framebufferInfo.width = layers;
  framebufferInfo._16_8_ = renderPass.m_internal;
  framebufferInfo.pAttachments._0_4_ = width;
  framebufferInfo._60_4_ = width;
  vk_local = (DeviceInterface *)colorAttachment.m_internal;
  colorAttachment_local.m_internal = renderPass.m_internal;
  ::vk::createFramebuffer
            (__return_storage_ptr__,vk,device,(VkFramebufferCreateInfo *)local_78,
             (VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

Move<VkFramebuffer> makeFramebuffer (const DeviceInterface&		vk,
									 const VkDevice				device,
									 const VkRenderPass			renderPass,
									 const VkImageView			colorAttachment,
									 const deUint32				width,
									 const deUint32				height,
									 const deUint32				layers)
{
	const VkFramebufferCreateInfo framebufferInfo = {
		VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO,		// VkStructureType                             sType;
		DE_NULL,										// const void*                                 pNext;
		(VkFramebufferCreateFlags)0,					// VkFramebufferCreateFlags                    flags;
		renderPass,										// VkRenderPass                                renderPass;
		1u,												// uint32_t                                    attachmentCount;
		&colorAttachment,								// const VkImageView*                          pAttachments;
		width,											// uint32_t                                    width;
		height,											// uint32_t                                    height;
		layers,											// uint32_t                                    layers;
	};

	return createFramebuffer(vk, device, &framebufferInfo);
}